

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::InjectBailOut(IRBuilder *this,uint offset)

{
  bool bVar1;
  uint bailOutOffset;
  IntConstOpnd *newSrc;
  BailOutInfo *this_00;
  BailOutInstrTemplate<IR::Instr> *this_01;
  
  bVar1 = Func::IsSimpleJit(this->m_func);
  if (bVar1) {
    return;
  }
  newSrc = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  bailOutOffset = offset;
  if (offset == 0xffffffff) {
    bailOutOffset = IR::Instr::GetByteCodeOffset(this->m_lastInstr);
  }
  this_00 = (BailOutInfo *)new<Memory::JitArenaAllocator>(0xb8,this->m_func->m_alloc,0x3d6ef4);
  BailOutInfo::BailOutInfo(this_00,bailOutOffset,this->m_func);
  this_01 = IR::BailOutInstrTemplate<IR::Instr>::New
                      (BailOnEqual,BailOutInjected,this_00,this_00->bailOutFunc);
  IR::Instr::SetSrc1(&this_01->super_Instr,&newSrc->super_Opnd);
  IR::Instr::SetSrc2(&this_01->super_Instr,&newSrc->super_Opnd);
  AddInstr(this,&this_01->super_Instr,offset);
  return;
}

Assistant:

void
IRBuilder::InjectBailOut(uint offset)
{
    if(m_func->IsSimpleJit())
    {
        return; // bailout injection is only applicable to full JIT
    }

    IR::IntConstOpnd * opnd = IR::IntConstOpnd::New(0, TyInt32, m_func);
    uint bailOutOffset = offset;
    if (bailOutOffset == Js::Constants::NoByteCodeOffset)
    {
        bailOutOffset = m_lastInstr->GetByteCodeOffset();
    }
    BailOutInfo * bailOutInfo = JitAnew(m_func->m_alloc, BailOutInfo, bailOutOffset, m_func);
    IR::BailOutInstr * instr = IR::BailOutInstr::New(Js::OpCode::BailOnEqual, IR::BailOutInjected, bailOutInfo, bailOutInfo->bailOutFunc);
    instr->SetSrc1(opnd);
    instr->SetSrc2(opnd);
    this->AddInstr(instr, offset);
}